

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-dtoa.cc
# Opt level: O3

bool __thiscall
FIX::double_conversion::RoundWeed
          (double_conversion *this,Vector<char> buffer,int length,uint64_t distance_too_high_w,
          uint64_t unsafe_interval,uint64_t rest,uint64_t ten_kappa,uint64_t unit)

{
  undefined4 in_register_0000000c;
  long lVar1;
  uint uVar2;
  ulong uVar3;
  uint64_t uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  lVar1 = CONCAT44(in_register_0000000c,length);
  if (distance_too_high_w < unsafe_interval) {
    __assert_fail("rest <= unsafe_interval",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                  ,0x8d,
                  "bool FIX::double_conversion::RoundWeed(Vector<char>, int, uint64_t, uint64_t, uint64_t, uint64_t, uint64_t)"
                 );
  }
  uVar5 = lVar1 - ten_kappa;
  uVar3 = uVar5 - unsafe_interval;
  bVar7 = distance_too_high_w - unsafe_interval < rest;
  if ((unsafe_interval <= uVar5 && uVar3 != 0) && !bVar7) {
    uVar2 = buffer.length_;
    uVar6 = (distance_too_high_w - rest) - unsafe_interval;
    uVar4 = unsafe_interval;
    while ((unsafe_interval = uVar4 + rest, unsafe_interval < uVar5 ||
           ((ten_kappa - lVar1) + rest + uVar4 <= uVar3))) {
      if ((int)buffer.start_ < (int)uVar2 || (int)uVar2 < 1) {
        __assert_fail("0 <= index && index < length_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                      ,0xca,
                      "T &FIX::double_conversion::Vector<char>::operator[](int) const [T = char]");
      }
      this[(ulong)uVar2 - 1] = (double_conversion)((char)this[(ulong)uVar2 - 1] + -1);
      bVar7 = uVar6 < rest;
      uVar6 = uVar6 - rest;
      if ((uVar5 <= unsafe_interval) || (uVar3 = uVar3 - rest, uVar4 = unsafe_interval, bVar7))
      goto LAB_00168d09;
    }
    bVar7 = false;
    unsafe_interval = uVar4;
  }
LAB_00168d09:
  uVar3 = lVar1 + ten_kappa;
  if (((uVar3 <= unsafe_interval) || (bVar7)) ||
     ((uVar3 <= rest + unsafe_interval &&
      (uVar3 - unsafe_interval <= (rest + unsafe_interval) - uVar3)))) {
    bVar7 = unsafe_interval <= distance_too_high_w + ten_kappa * -4 &&
            ten_kappa * 2 <= unsafe_interval;
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

static bool RoundWeed(Vector<char> buffer,
                      int length,
                      uint64_t distance_too_high_w,
                      uint64_t unsafe_interval,
                      uint64_t rest,
                      uint64_t ten_kappa,
                      uint64_t unit) {
  uint64_t small_distance = distance_too_high_w - unit;
  uint64_t big_distance = distance_too_high_w + unit;
  // Let w_low  = too_high - big_distance, and
  //     w_high = too_high - small_distance.
  // Note: w_low < w < w_high
  //
  // The real w (* unit) must lie somewhere inside the interval
  // ]w_low; w_high[ (often written as "(w_low; w_high)")

  // Basically the buffer currently contains a number in the unsafe interval
  // ]too_low; too_high[ with too_low < w < too_high
  //
  //  too_high - - - - - - - - - - - - - - - - - - - - - - - - - - - - - - - - -
  //                     ^v 1 unit            ^      ^                 ^      ^
  //  boundary_high ---------------------     .      .                 .      .
  //                     ^v 1 unit            .      .                 .      .
  //   - - - - - - - - - - - - - - - - - - -  +  - - + - - - - - -     .      .
  //                                          .      .         ^       .      .
  //                                          .  big_distance  .       .      .
  //                                          .      .         .       .    rest
  //                              small_distance     .         .       .      .
  //                                          v      .         .       .      .
  //  w_high - - - - - - - - - - - - - - - - - -     .         .       .      .
  //                     ^v 1 unit                   .         .       .      .
  //  w ----------------------------------------     .         .       .      .
  //                     ^v 1 unit                   v         .       .      .
  //  w_low  - - - - - - - - - - - - - - - - - - - - -         .       .      .
  //                                                           .       .      v
  //  buffer --------------------------------------------------+-------+--------
  //                                                           .       .
  //                                                  safe_interval    .
  //                                                           v       .
  //   - - - - - - - - - - - - - - - - - - - - - - - - - - - - - -     .
  //                     ^v 1 unit                                     .
  //  boundary_low -------------------------                     unsafe_interval
  //                     ^v 1 unit                                     v
  //  too_low  - - - - - - - - - - - - - - - - - - - - - - - - - - - - - - - - -
  //
  //
  // Note that the value of buffer could lie anywhere inside the range too_low
  // to too_high.
  //
  // boundary_low, boundary_high and w are approximations of the real boundaries
  // and v (the input number). They are guaranteed to be precise up to one unit.
  // In fact the error is guaranteed to be strictly less than one unit.
  //
  // Anything that lies outside the unsafe interval is guaranteed not to round
  // to v when read again.
  // Anything that lies inside the safe interval is guaranteed to round to v
  // when read again.
  // If the number inside the buffer lies inside the unsafe interval but not
  // inside the safe interval then we simply do not know and bail out (returning
  // false).
  //
  // Similarly we have to take into account the imprecision of 'w' when finding
  // the closest representation of 'w'. If we have two potential
  // representations, and one is closer to both w_low and w_high, then we know
  // it is closer to the actual value v.
  //
  // By generating the digits of too_high we got the largest (closest to
  // too_high) buffer that is still in the unsafe interval. In the case where
  // w_high < buffer < too_high we try to decrement the buffer.
  // This way the buffer approaches (rounds towards) w.
  // There are 3 conditions that stop the decrementation process:
  //   1) the buffer is already below w_high
  //   2) decrementing the buffer would make it leave the unsafe interval
  //   3) decrementing the buffer would yield a number below w_high and farther
  //      away than the current number. In other words:
  //              (buffer{-1} < w_high) && w_high - buffer{-1} > buffer - w_high
  // Instead of using the buffer directly we use its distance to too_high.
  // Conceptually rest ~= too_high - buffer
  // We need to do the following tests in this order to avoid over- and
  // underflows.
  ASSERT(rest <= unsafe_interval);
  while (rest < small_distance &&  // Negated condition 1
         unsafe_interval - rest >= ten_kappa &&  // Negated condition 2
         (rest + ten_kappa < small_distance ||  // buffer{-1} > w_high
          small_distance - rest >= rest + ten_kappa - small_distance)) {
    buffer[length - 1]--;
    rest += ten_kappa;
  }

  // We have approached w+ as much as possible. We now test if approaching w-
  // would require changing the buffer. If yes, then we have two possible
  // representations close to w, but we cannot decide which one is closer.
  if (rest < big_distance &&
      unsafe_interval - rest >= ten_kappa &&
      (rest + ten_kappa < big_distance ||
       big_distance - rest > rest + ten_kappa - big_distance)) {
    return false;
  }

  // Weeding test.
  //   The safe interval is [too_low + 2 ulp; too_high - 2 ulp]
  //   Since too_low = too_high - unsafe_interval this is equivalent to
  //      [too_high - unsafe_interval + 4 ulp; too_high - 2 ulp]
  //   Conceptually we have: rest ~= too_high - buffer
  return (2 * unit <= rest) && (rest <= unsafe_interval - 4 * unit);
}